

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcStdin.c
# Opt level: O1

void Wlc_ComputeSum(char *pRes,char *pAdd,int nBits,int Radix)

{
  ulong uVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  char cVar5;
  
  if (0 < nBits) {
    uVar1 = 0;
    bVar2 = false;
    do {
      cVar3 = bVar2 + pRes[uVar1] + pAdd[uVar1];
      iVar4 = (int)cVar3;
      cVar5 = (char)Radix;
      if (iVar4 < Radix) {
        cVar5 = '\0';
      }
      cVar3 = cVar3 - cVar5;
      if ((cVar3 < '\0') || (Radix <= cVar3)) {
        __assert_fail("Sum >= 0 && Sum < Radix",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcStdin.c"
                      ,0x39,"void Wlc_ComputeSum(char *, char *, int, int)");
      }
      pRes[uVar1] = cVar3;
      bVar2 = Radix <= iVar4;
      uVar1 = uVar1 + 1;
    } while ((uint)nBits != uVar1);
    if (Radix <= iVar4) {
      __assert_fail("Carry == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcStdin.c"
                    ,0x3c,"void Wlc_ComputeSum(char *, char *, int, int)");
    }
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Converts a bit-string into a number in a given radix.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Wlc_ComputeSum( char * pRes, char * pAdd, int nBits, int Radix )
{
    char Carry = 0;  int i; 
    for ( i = 0; i < nBits; i++ )
    {
        char Sum = pRes[i] + pAdd[i] + Carry;
        if ( Sum >= Radix )
        {
            Sum -= Radix;
            Carry = 1;
        }
        else 
            Carry = 0;
        assert( Sum >= 0 && Sum < Radix );
        pRes[i] = Sum;
    }
    assert( Carry == 0 );
}